

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

_Bool Curl_ossl_data_pending(connectdata *conn,int connindex)

{
  int iVar1;
  int connindex_local;
  connectdata *conn_local;
  
  if (conn->ssl[connindex].handle == (SSL *)0x0) {
    conn_local._7_1_ = false;
  }
  else {
    iVar1 = SSL_pending((SSL *)conn->ssl[connindex].handle);
    conn_local._7_1_ = true;
    if ((iVar1 == 0) && (conn_local._7_1_ = false, conn->proxy_ssl[connindex].handle != (SSL *)0x0))
    {
      iVar1 = SSL_pending((SSL *)conn->proxy_ssl[connindex].handle);
      conn_local._7_1_ = iVar1 != 0;
    }
  }
  return conn_local._7_1_;
}

Assistant:

bool Curl_ossl_data_pending(const struct connectdata *conn, int connindex)
{
  if(conn->ssl[connindex].handle)
    /* SSL is in use */
    return (0 != SSL_pending(conn->ssl[connindex].handle) ||
           (conn->proxy_ssl[connindex].handle &&
            0 != SSL_pending(conn->proxy_ssl[connindex].handle))) ?
           TRUE : FALSE;
  return FALSE;
}